

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O3

void __thiscall amrex::MultiCutFab::setVal(MultiCutFab *this,Real val)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int i;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  MFIter mfi;
  Box local_ec;
  Array4<double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)this,'\0');
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      iVar3 = local_90.currentIndex;
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar3 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[local_90.currentIndex];
      }
      if (*(int *)&((this->m_cellflags->m_fabs_v).
                    super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar3]->
                   super_BaseFab<amrex::EBCellFlag>).field_0x44 == 1) {
        FabArray<amrex::CutFab>::array<amrex::CutFab,_0>(&local_d0,&this->m_data,&local_90);
        FabArrayBase::fabbox
                  (&local_ec,local_90.fabArray,
                   ((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[local_90.currentIndex]);
        auVar2 = _DAT_0065b9b0;
        auVar1 = _DAT_0065b9a0;
        lVar4 = (long)(this->m_data).super_FabArrayBase.n_comp;
        if (0 < lVar4) {
          uVar6 = local_ec.bigend.vect[0] - local_ec.smallend.vect[0];
          auVar12._4_4_ = 0;
          auVar12._0_4_ = uVar6;
          auVar12._8_4_ = uVar6;
          auVar12._12_4_ = 0;
          auVar12 = auVar12 ^ _DAT_0065b9b0;
          lVar9 = 0;
          lVar5 = 0;
          do {
            iVar3 = local_ec.smallend.vect[2];
            if (local_ec.smallend.vect[2] <= local_ec.bigend.vect[2]) {
              do {
                if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1]) {
                  lVar8 = (long)local_d0.p +
                          local_d0.nstride * lVar9 +
                          ((long)local_ec.smallend.vect[1] - (long)local_d0.begin.y) *
                          local_d0.jstride * 8 +
                          ((long)iVar3 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                          (long)local_d0.begin.x * -8 + (long)local_ec.smallend.vect[0] * 8 + 8;
                  lVar10 = (long)local_ec.smallend.vect[1];
                  do {
                    if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
                      uVar7 = 0;
                      do {
                        auVar13._8_4_ = (int)uVar7;
                        auVar13._0_8_ = uVar7;
                        auVar13._12_4_ = (int)(uVar7 >> 0x20);
                        auVar13 = (auVar13 | auVar1) ^ auVar2;
                        if ((bool)(~(auVar12._4_4_ < auVar13._4_4_ ||
                                    auVar12._0_4_ < auVar13._0_4_ && auVar13._4_4_ == auVar12._4_4_)
                                  & 1)) {
                          *(Real *)(lVar8 + -8 + uVar7 * 8) = val;
                        }
                        if (auVar13._12_4_ <= auVar12._12_4_ &&
                            (auVar13._8_4_ <= auVar12._8_4_ || auVar13._12_4_ != auVar12._12_4_)) {
                          *(Real *)(lVar8 + uVar7 * 8) = val;
                        }
                        uVar7 = uVar7 + 2;
                      } while (((ulong)uVar6 + 2 & 0xfffffffffffffffe) != uVar7);
                    }
                    lVar10 = lVar10 + 1;
                    lVar8 = lVar8 + local_d0.jstride * 8;
                  } while (local_ec.bigend.vect[1] + 1 != (int)lVar10);
                }
                bVar11 = iVar3 != local_ec.bigend.vect[2];
                iVar3 = iVar3 + 1;
              } while (bVar11);
            }
            lVar5 = lVar5 + 1;
            lVar9 = lVar9 + 8;
          } while (lVar5 != lVar4);
        }
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MultiCutFab::setVal (Real val)
{
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(m_data); mfi.isValid(); ++mfi)
    {
        if (ok(mfi)) {
            Array4<Real> const& a = m_data.array(mfi);
            Box const& b = mfi.fabbox();
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(b, m_data.nComp(), i, j, k, n,
            {
                a(i,j,k,n) = val;
            });
        }
    }
}